

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void __thiscall module_level_html_actions::level_start(module_level_html_actions *this,int level)

{
  char *pcVar1;
  ostream *poVar2;
  
  poVar2 = (ostream *)&std::cout;
  if (level < 0x3fffffff) {
    poVar2 = std::operator<<((ostream *)&std::cout,"  <h2 id=\'level:");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,level);
    poVar2 = std::operator<<(poVar2,"\'>Level ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,level);
    pcVar1 = "</h2>\n";
  }
  else {
    pcVar1 = "  <h2>Level <em>undetermined</em></h2>\n";
  }
  std::operator<<(poVar2,pcVar1);
  this->level_ = level;
  return;
}

Assistant:

void level_start( int level )
    {
        if( level >= unknown_level )
        {
            std::cout << "  <h2>Level <em>undetermined</em></h2>\n";
        }
        else
        {
            std::cout << "  <h2 id='level:" << level << "'>Level " << level << "</h2>\n";
        }

        level_ = level;
    }